

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::addItem
          (QGraphicsSceneBspTreeIndexPrivate *this,QGraphicsItem *item,bool recursive)

{
  long lVar1;
  QGraphicsItemPrivate *pQVar2;
  QList<QGraphicsItem_*> *this_00;
  qsizetype qVar3;
  undefined1 in_DL;
  QGraphicsSceneBspTreeIndexPrivate *in_RSI;
  QGraphicsSceneBspTreeIndexPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  parameter_type in_stack_ffffffffffffffa8;
  QGraphicsSceneBspTreeIndexPrivate *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined3 in_stack_ffffffffffffffc4;
  uint uVar5;
  char local_28 [4];
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_DL,in_stack_ffffffffffffffc4) & 0x1ffffff;
  if (in_RSI != (QGraphicsSceneBspTreeIndexPrivate *)0x0) {
    purgeRemovedItems((QGraphicsSceneBspTreeIndexPrivate *)
                      (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffffc4),in_stack_ffffffffffffffc0)
                      & 0x1ffffffffffffff));
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&(in_RSI->super_QGraphicsSceneIndexPrivate).field_0x8);
    pQVar2->globalStackingOrder = -1;
    invalidateSortCache(in_stack_ffffffffffffffb0);
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&(in_RSI->super_QGraphicsSceneIndexPrivate).field_0x8);
    if (pQVar2->index == -1) {
      QList<QGraphicsItem_*>::operator<<
                ((QList<QGraphicsItem_*> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      startIndexTimer(in_RDI,in_stack_ffffffffffffffdc);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(uVar5,in_stack_ffffffffffffffc0),(char *)in_RDI,
                 (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(char *)in_stack_ffffffffffffffa8);
      QMessageLogger::warning
                (local_28,
                 "QGraphicsSceneBspTreeIndex::addItem: item has already been added to this BSP");
    }
    if ((uVar5 & 0x1000000) != 0) {
      iVar4 = 0;
      while( true ) {
        this_00 = (QList<QGraphicsItem_*> *)(long)iVar4;
        pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&(in_RSI->super_QGraphicsSceneIndexPrivate).field_0x8);
        qVar3 = QList<QGraphicsItem_*>::size(&pQVar2->children);
        if (qVar3 <= (long)this_00) break;
        QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
        operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)&(in_RSI->super_QGraphicsSceneIndexPrivate).field_0x8);
        QList<QGraphicsItem_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffa8);
        addItem(in_RSI,(QGraphicsItem *)CONCAT44(uVar5,iVar4),SUB81((ulong)in_RDI >> 0x38,0));
        iVar4 = iVar4 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::addItem(QGraphicsItem *item, bool recursive)
{
    if (!item)
        return;

    // Prevent reusing a recently deleted pointer: purge all removed item from our lists.
    purgeRemovedItems();

    // Invalidate any sort caching; arrival of a new item means we need to resort.
    // Update the scene's sort cache settings.
    item->d_ptr->globalStackingOrder = -1;
    invalidateSortCache();

    // Indexing requires sceneBoundingRect(), but because \a item might
    // not be completely constructed at this point, we need to store it in
    // a temporary list and schedule an indexing for later.
    if (item->d_ptr->index == -1) {
        Q_ASSERT(!unindexedItems.contains(item));
        unindexedItems << item;
        startIndexTimer(0);
    } else {
        Q_ASSERT(indexedItems.contains(item));
        qWarning("QGraphicsSceneBspTreeIndex::addItem: item has already been added to this BSP");
    }

    if (recursive) {
        for (int i = 0; i < item->d_ptr->children.size(); ++i)
            addItem(item->d_ptr->children.at(i), recursive);
    }
}